

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionImageMetadataUniform
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  DiagnosticStream DStack_1f8;
  
  sVar2 = ValidateKernelDecl(_,inst);
  if (sVar2 != SPV_SUCCESS) {
    return sVar2;
  }
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,5);
  bVar1 = IsUint32Constant(_,uVar3);
  if (bVar1) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar1 = IsUint32Constant(_,uVar3);
    if (!bVar1) {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "DescriptorSet must be a 32-bit unsigned integer OpConstant";
      lVar4 = 0x3a;
      goto LAB_001d390c;
    }
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,7);
    bVar1 = IsUint32Constant(_,uVar3);
    if (bVar1) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,8);
      bVar1 = IsUint32Constant(_,uVar3);
      if (bVar1) {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,9);
        bVar1 = IsUint32Constant(_,uVar3);
        if (bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar5 = "Size must be a 32-bit unsigned integer OpConstant";
        lVar4 = 0x31;
      }
      else {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar5 = "Offset must be a 32-bit unsigned integer OpConstant";
        lVar4 = 0x33;
      }
      goto LAB_001d390c;
    }
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar5 = "Binding must be a 32-bit unsigned integer OpConstant";
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar5 = "Ordinal must be a 32-bit unsigned integer OpConstant";
  }
  lVar4 = 0x34;
LAB_001d390c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar5,lVar4);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionImageMetadataUniform(
    ValidationState_t& _, const Instruction* inst) {
  if (auto error = ValidateKernelDecl(_, inst)) {
    return error;
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Ordinal must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "DescriptorSet must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Binding must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(8))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(9))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}